

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelUri.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
aeron::archive::ChannelUri::get
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ChannelUri *this,string *key,string *defaultValue)

{
  iterator iVar1;
  size_type sVar2;
  pointer pcVar3;
  
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->params_)._M_h,key);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    (__return_storage_ptr__->super_type).m_initialized = false;
    (__return_storage_ptr__->super_type).m_storage.dummy_.aligner_ =
         (type)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x10);
    pcVar3 = (defaultValue->_M_dataplus)._M_p;
    sVar2 = defaultValue->_M_string_length;
  }
  else {
    (__return_storage_ptr__->super_type).m_initialized = false;
    (__return_storage_ptr__->super_type).m_storage.dummy_.aligner_ =
         (type)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x10);
    pcVar3 = *(pointer *)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     ._M_cur + 0x28);
    sVar2 = *(size_type *)
             ((long)iVar1.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur + 0x30);
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->super_type).m_storage,pcVar3,pcVar3 + sVar2);
  (__return_storage_ptr__->super_type).m_initialized = true;
  return __return_storage_ptr__;
}

Assistant:

boost::optional<std::string> ChannelUri::get(const std::string& key, const std::string& defaultValue) {
    auto it = params_.find(key);
    if (it == params_.end()) {
        return defaultValue;
    }
    return it->second;
}